

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::DayOfMonthFun::GetFunctions(void)

{
  undefined8 in_RDI;
  
  GetDatePartFunction<duckdb::DatePart::DayOperator>();
  return in_RDI;
}

Assistant:

ScalarFunctionSet DayOfMonthFun::GetFunctions() {
	return GetDatePartFunction<DatePart::DayOperator>();
}